

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

double __thiscall double_conversion::Double::PreviousDouble(Double *this)

{
  int iVar1;
  uint64_t uVar2;
  long *in_RDI;
  Double in_stack_ffffffffffffffe0;
  Double in_stack_ffffffffffffffe8;
  double local_8;
  
  if (*in_RDI == -0x10000000000000) {
    local_8 = Infinity();
    local_8 = -local_8;
  }
  else {
    iVar1 = Sign((Double *)in_stack_ffffffffffffffe0.d64_);
    if (iVar1 < 0) {
      Double((Double *)&stack0xffffffffffffffe8,*in_RDI + 1);
      local_8 = value((Double *)0x9c1192);
    }
    else {
      uVar2 = Significand(in_stack_ffffffffffffffe8.d64_);
      if (uVar2 == 0) {
        local_8 = -0.0;
      }
      else {
        Double((Double *)&stack0xffffffffffffffe0,*in_RDI - 1);
        local_8 = value((Double *)0x9c11d8);
      }
    }
  }
  return local_8;
}

Assistant:

double PreviousDouble() const {
    if (d64_ == (kInfinity | kSignMask)) return -Infinity();
    if (Sign() < 0) {
      return Double(d64_ + 1).value();
    } else {
      if (Significand() == 0) return -0.0;
      return Double(d64_ - 1).value();
    }
  }